

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O1

section * __thiscall ELFIO::elfio::create_section(elfio *this)

{
  pointer *pppsVar1;
  bool bVar2;
  iterator __position;
  uchar uVar3;
  uint uVar4;
  section *psVar5;
  section *new_section;
  section *local_10;
  
  uVar3 = get_class(this);
  if (uVar3 == '\x01') {
    local_10 = (section *)operator_new(0x68);
    bVar2 = (this->convertor).need_conversion;
    local_10->_vptr_section = (_func_int **)&PTR__section_impl_001276d0;
    local_10[7]._vptr_section = (_func_int **)(local_10 + 9);
    local_10[8]._vptr_section = (_func_int **)0x0;
    *(undefined1 *)&local_10[9]._vptr_section = 0;
    *(bool *)((long)&local_10[0xc]._vptr_section + 4) = bVar2;
    local_10[5]._vptr_section = (_func_int **)0x0;
    local_10[3]._vptr_section = (_func_int **)0x0;
    local_10[4]._vptr_section = (_func_int **)0x0;
    local_10[1]._vptr_section = (_func_int **)0x0;
    local_10[2]._vptr_section = (_func_int **)0x0;
    *(undefined1 *)((long)&local_10[0xc]._vptr_section + 5) = 0;
    local_10[0xb]._vptr_section = (_func_int **)0x0;
    psVar5 = local_10 + 0xc;
  }
  else {
    if (uVar3 != '\x02') {
      return (section *)0x0;
    }
    local_10 = (section *)operator_new(0x80);
    bVar2 = (this->convertor).need_conversion;
    local_10->_vptr_section = (_func_int **)&PTR__section_impl_00127588;
    local_10[10]._vptr_section = (_func_int **)(local_10 + 0xc);
    local_10[0xb]._vptr_section = (_func_int **)0x0;
    *(undefined1 *)&local_10[0xc]._vptr_section = 0;
    *(bool *)((long)&local_10[0xf]._vptr_section + 4) = bVar2;
    local_10[7]._vptr_section = (_func_int **)0x0;
    local_10[8]._vptr_section = (_func_int **)0x0;
    local_10[5]._vptr_section = (_func_int **)0x0;
    local_10[6]._vptr_section = (_func_int **)0x0;
    local_10[3]._vptr_section = (_func_int **)0x0;
    local_10[4]._vptr_section = (_func_int **)0x0;
    local_10[1]._vptr_section = (_func_int **)0x0;
    local_10[2]._vptr_section = (_func_int **)0x0;
    *(undefined1 *)((long)&local_10[0xf]._vptr_section + 5) = 0;
    local_10[0xe]._vptr_section = (_func_int **)0x0;
    psVar5 = local_10 + 0xf;
  }
  *(undefined4 *)&psVar5->_vptr_section = 0;
  uVar4 = (uint)(*(int *)&(this->sections_).
                          super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                *(int *)&(this->sections_).
                         super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 3;
  (*local_10->_vptr_section[0x1e])
            (local_10,(ulong)(ushort)uVar4,local_10->_vptr_section,(ulong)uVar4);
  __position._M_current =
       (this->sections_).super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->sections_).super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<ELFIO::section*,std::allocator<ELFIO::section*>>::
    _M_realloc_insert<ELFIO::section*const&>
              ((vector<ELFIO::section*,std::allocator<ELFIO::section*>> *)&this->sections_,
               __position,&local_10);
  }
  else {
    *__position._M_current = local_10;
    pppsVar1 = &(this->sections_).
                super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppsVar1 = *pppsVar1 + 1;
  }
  return local_10;
}

Assistant:

section* create_section()
    {
        section*      new_section;
        unsigned char file_class = get_class();

        if ( file_class == ELFCLASS64 ) {
            new_section = new section_impl<Elf64_Shdr>( convertor );
        }
        else if ( file_class == ELFCLASS32 ) {
            new_section = new section_impl<Elf32_Shdr>( convertor );
        }
        else {
            return 0;
        }

        new_section->set_index( (Elf_Half)sections_.size() );
        sections_.push_back( new_section );

        return new_section;
    }